

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrbitalElements.cc
# Opt level: O0

void __thiscall libsgp4::OrbitalElements::OrbitalElements(OrbitalElements *this,Tle *tle)

{
  DateTime DVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double del0;
  double a0;
  double del1;
  double temp;
  double betao;
  double betao2;
  double eosq;
  double x3thm1;
  double theta2;
  double cosio;
  double a1;
  Tle *tle_local;
  OrbitalElements *this_local;
  
  DateTime::DateTime(&this->epoch_);
  dVar2 = Tle::MeanAnomaly(tle,false);
  this->mean_anomoly_ = dVar2;
  dVar2 = Tle::RightAscendingNode(tle,false);
  this->ascending_node_ = dVar2;
  dVar2 = Tle::ArgumentPerigee(tle,false);
  this->argument_perigee_ = dVar2;
  dVar2 = Tle::Eccentricity(tle);
  this->eccentricity_ = dVar2;
  dVar2 = Tle::Inclination(tle,false);
  this->inclination_ = dVar2;
  dVar2 = Tle::MeanMotion(tle);
  this->mean_motion_ = (dVar2 * 6.283185307179586) / 1440.0;
  dVar2 = Tle::BStar(tle);
  this->bstar_ = dVar2;
  DVar1 = Tle::Epoch(tle);
  (this->epoch_).m_encoded = DVar1.m_encoded;
  dVar2 = kXKE;
  dVar3 = MeanMotion(this);
  dVar4 = pow(dVar2 / dVar3,0.6666666666666666);
  dVar2 = Inclination(this);
  dVar2 = cos(dVar2);
  dVar3 = Eccentricity(this);
  dVar5 = Eccentricity(this);
  dVar3 = 1.0 - dVar3 * dVar5;
  dVar5 = sqrt(dVar3);
  dVar3 = ((dVar2 * dVar2 * 3.0 + -1.0) * 0.0008119620000000001) / (dVar5 * dVar3);
  dVar2 = dVar3 / (dVar4 * dVar4);
  dVar4 = dVar4 * (-dVar2 * (dVar2 * ((dVar2 * 134.0) / 81.0 + 1.0) + 0.3333333333333333) + 1.0);
  dVar3 = dVar3 / (dVar4 * dVar4);
  dVar2 = MeanMotion(this);
  this->recovered_mean_motion_ = dVar2 / (dVar3 + 1.0);
  this->recovered_semi_major_axis_ = dVar4 / (1.0 - dVar3);
  dVar2 = RecoveredSemiMajorAxis(this);
  dVar3 = Eccentricity(this);
  this->perigee_ = (dVar2 * (1.0 - dVar3) + -1.0) * 6378.135;
  dVar2 = RecoveredMeanMotion(this);
  this->period_ = 6.283185307179586 / dVar2;
  return;
}

Assistant:

OrbitalElements::OrbitalElements(const Tle& tle)
{
    /*
     * extract and format tle data
     */
    mean_anomoly_ = tle.MeanAnomaly(false);
    ascending_node_ = tle.RightAscendingNode(false);
    argument_perigee_ = tle.ArgumentPerigee(false);
    eccentricity_ = tle.Eccentricity();
    inclination_ = tle.Inclination(false);
    mean_motion_ = tle.MeanMotion() * kTWOPI / kMINUTES_PER_DAY;
    bstar_ = tle.BStar();
    epoch_ = tle.Epoch();

    /*
     * recover original mean motion (xnodp) and semimajor axis (aodp)
     * from input elements
     */
    const double a1 = pow(kXKE / MeanMotion(), kTWOTHIRD);
    const double cosio = cos(Inclination());
    const double theta2 = cosio * cosio;
    const double x3thm1 = 3.0 * theta2 - 1.0;
    const double eosq = Eccentricity() * Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);
    const double temp = (1.5 * kCK2) * x3thm1 / (betao * betao2);
    const double del1 = temp / (a1 * a1);
    const double a0 = a1 * (1.0 - del1 * (1.0 / 3.0 + del1 * (1.0 + del1 * 134.0 / 81.0)));
    const double del0 = temp / (a0 * a0);

    recovered_mean_motion_ = MeanMotion() / (1.0 + del0);
    /*
     * alternative way to calculate
     * doesnt affect final results
     * recovered_semi_major_axis_ = pow(XKE / RecoveredMeanMotion(), TWOTHIRD);
     */
    recovered_semi_major_axis_ = a0 / (1.0 - del0);

    /*
     * find perigee and period
     */
    perigee_ = (RecoveredSemiMajorAxis() * (1.0 - Eccentricity()) - kAE) * kXKMPER;
    period_ = kTWOPI / RecoveredMeanMotion();
}